

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GroupStackDepthQueryCase::iterate
          (GroupStackDepthQueryCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  ScopedLogSection local_d0;
  string local_c8;
  string local_a8;
  CallLogWrapper local_88;
  ResultCollector local_70;
  
  bVar4 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (bVar4) {
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    glu::CallLogWrapper::CallLogWrapper
              (&local_88,(Functions *)CONCAT44(extraout_var,iVar5),
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    paVar1 = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8," // ERROR: ","");
    tcu::ResultCollector::ResultCollector(&local_70,pTVar3,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_88.m_enableLog = true;
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Initial","");
    paVar2 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,pTVar3,&local_c8,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    gls::StateQueryUtil::verifyStateInteger(&local_70,&local_88,0x826d,1,this->m_type);
    tcu::TestLog::endSection(local_d0.m_log);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Scoped","");
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Scoped","");
    tcu::ScopedLogSection::ScopedLogSection(&local_d0,pTVar3,&local_c8,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glPushDebugGroup(&local_88,0x824a,1,-1,"Application group 1");
    gls::StateQueryUtil::verifyStateInteger(&local_70,&local_88,0x826d,2,this->m_type);
    glu::CallLogWrapper::glPopDebugGroup(&local_88);
    tcu::TestLog::endSection(local_d0.m_log);
    tcu::ResultCollector::setTestContextResult
              (&local_70,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_message._M_dataplus._M_p != &local_70.m_message.field_2) {
      operator_delete(local_70.m_message._M_dataplus._M_p,
                      local_70.m_message.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.m_prefix._M_dataplus._M_p != &local_70.m_prefix.field_2) {
      operator_delete(local_70.m_prefix._M_dataplus._M_p,
                      local_70.m_prefix.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::~CallLogWrapper(&local_88);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0xadb);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GroupStackDepthQueryCase::IterateResult GroupStackDepthQueryCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Initial", "Initial");

		gls::StateQueryUtil::verifyStateInteger(result, gl, GL_DEBUG_GROUP_STACK_DEPTH, 1, m_type);
	}

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Scoped", "Scoped");

		gl.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 1, -1, "Application group 1");
		gls::StateQueryUtil::verifyStateInteger(result, gl, GL_DEBUG_GROUP_STACK_DEPTH, 2, m_type);
		gl.glPopDebugGroup();
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}